

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::selectWithinDistance
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,
          model_t *model_coefficients,double threshold,vector<int,_std::allocator<int>_> *inliers)

{
  element_type *peVar1;
  __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var2;
  reference pvVar3;
  value_type *in_RDX;
  undefined8 in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  vector<double,_std::allocator<double>_> dist;
  __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  value_type *__x;
  __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_50;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> local_38;
  value_type *local_20;
  double local_18;
  undefined8 local_10;
  
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xb8e052);
  peVar1 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xb8e060);
  std::vector<int,_std::allocator<int>_>::size(peVar1);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[8])(in_RDI,local_10,&local_38);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xb8e09b);
  peVar1 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xb8e0b3);
  std::vector<int,_std::allocator<int>_>::size(peVar1);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  local_50 = (__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x0;
  __x = local_20;
  while( true ) {
    this_00 = local_50;
    p_Var2 = (__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::vector<double,_std::allocator<double>_>::size(&local_38);
    if (p_Var2 <= this_00) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(size_type)local_50)
    ;
    if (*pvVar3 < local_18) {
      peVar1 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(this_00);
      std::vector<int,_std::allocator<int>_>::operator[](peVar1,(size_type)local_50);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,__x);
    }
    local_50 = local_50 + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::selectWithinDistance(
    const model_t & model_coefficients,
    const double threshold,
    std::vector<int> &inliers )
{
  std::vector<double> dist;
  dist.reserve(indices_->size());
  getDistancesToModel( model_coefficients, dist );

  inliers.clear();
  inliers.reserve(indices_->size());
  for( size_t i = 0; i < dist.size(); ++i )
  {
    if( dist[i] < threshold )
      inliers.push_back( (*indices_)[i] );
  }
}